

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined7 in_register_00000081;
  uint uVar7;
  unsigned_long local_50;
  size_t inlineCacheOffset;
  uint local_39;
  undefined1 local_35;
  uint uStack_34;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  uVar7 = (uint)CONCAT71(in_register_00000081,isLoadMethod);
  inlineCacheOffset = (size_t)this;
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    uStack_34 = uVar7;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x75b,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar3) goto LAB_007d4f11;
    *puVar5 = 0;
    uVar7 = uStack_34;
  }
  sVar2 = inlineCacheOffset;
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
     (local_35 = (undefined1)value, value < 0x100)) {
    local_39 = cacheId;
    uVar4 = Data::EncodeT<(Js::LayoutSize)0>
                      ((Data *)(inlineCacheOffset + 0x70),op,&local_39,5,
                       (ByteCodeWriter *)inlineCacheOffset);
    if ((ulong)uVar4 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 6 != (ulong)*(uint *)(sVar2 + 0x88))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x761,
                                  "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>))"
                                  ,
                                  "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>)"
                                 );
      if (!bVar3) {
LAB_007d4f11:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    local_50 = (ulong)uVar4 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 1;
    lVar6 = 0x48;
    if (!isStore) {
      lVar6 = (ulong)((uVar7 & 0xff) << 5) + 0x38;
    }
    SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount> *)
               (lVar6 + inlineCacheOffset),*(ArenaAllocator **)(*(long *)inlineCacheOffset + 0x18),
               &local_50);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootCP(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore)
    {
        Assert(!isLoadMethod || !isStore);
        OpLayoutT_ElementRootCP<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>));
            size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                + offsetof(OpLayoutT_ElementRootCP<SizePolicy>, inlineCacheIndex);

            // Root object inline cache index are given out from 0, but it will be at index after
            // all the plain inline cache. Store the offset of the inline cache index to patch it up later.
            SListBase<size_t> * rootObjectInlineCacheOffsets = isStore ?
                &rootObjectStoreInlineCacheOffsets : isLoadMethod ? &rootObjectLoadMethodInlineCacheOffsets : &rootObjectLoadInlineCacheOffsets;
            rootObjectInlineCacheOffsets->Prepend(this->m_labelOffsets->GetAllocator(), inlineCacheOffset);
            return true;
        }
        return false;
    }